

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O0

void __thiscall expr_md_array_Test::TestBody(expr_md_array_Test *this)

{
  allocator<unsigned_int> *paVar1;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  bool bVar2;
  int iVar3;
  Generator *pGVar4;
  Var *pVVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  reference pvVar7;
  char *pcVar8;
  long *plVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  AssertHelper local_550;
  Message local_548 [6];
  exception *e_3;
  pair<unsigned_int,_unsigned_int> local_510;
  int local_508 [2];
  pair<unsigned_int,_unsigned_int> local_500;
  undefined1 local_4f8 [24];
  TrueWithString gtest_msg_3;
  AssertHelper local_4c0;
  Message local_4b8;
  int local_4ac;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_2;
  pair<unsigned_int,_unsigned_int> local_490;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_488;
  VarSlice *slice;
  AssertHelper local_460;
  Message local_458 [6];
  exception *e_2;
  pointer ppStack_418;
  TrueWithString gtest_msg_2;
  AssertHelper local_3f0;
  Message local_3e8 [2];
  StmtException *anon_var_0_1;
  type e_1;
  undefined1 local_399;
  undefined1 auStack_398 [7];
  bool gtest_caught_expected_1;
  TrueWithString gtest_msg_1;
  Message local_370 [2];
  StmtException *anon_var_0;
  type e;
  undefined1 local_330 [24];
  pointer ppStack_318;
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  _Hash_node_base local_2f0;
  __node_base local_2e8;
  _Base_ptr local_2e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2d8;
  allocator<char> local_2b9;
  string local_2b8;
  Var *local_298;
  Var *c;
  uint local_288 [2];
  __buckets_ptr local_280;
  undefined1 local_278 [39];
  allocator<char> local_251;
  string local_250;
  Var *local_230;
  Var *b;
  Message local_220;
  int local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_1;
  Message local_1f8;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  float local_1d0 [2];
  Var *local_1c8;
  Param *local_1c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  allocator<char> local_199;
  string local_198;
  undefined8 local_178;
  Var *a;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context context;
  expr_md_array_Test *this_local;
  
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar4 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"a",&local_199);
  local_1d0[0] = 5.60519e-45;
  local_1d0[1] = 2.8026e-45;
  local_1c8 = (Var *)local_1d0;
  local_1c0 = (Param *)0x2;
  paVar1 = (allocator<unsigned_int> *)
           ((long)&gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl + 7);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l_01._M_len = (size_type)local_1c0;
  __l_01._M_array = (iterator)local_1c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1b8,__l_01,paVar1);
  pVVar5 = kratos::Generator::var(pGVar4,&local_198,0x10,&local_1b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1b8);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  local_178 = pVVar5;
  (*(pVVar5->super_IRNode)._vptr_IRNode[0x19])(pVVar5,0);
  pvVar6 = kratos::Var::size((Var *)local_178);
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar6,0);
  local_1ec = 4;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_1e8,"a.size()[0]","4",pvVar7,&local_1ec);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar2) {
    testing::Message::Message(&local_1f8);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x164,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  pvVar6 = kratos::Var::size((Var *)local_178);
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar6,1);
  local_214 = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_210,"a.size()[1]","2",pvVar7,&local_214);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar2) {
    testing::Message::Message(&local_220);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&b,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x165,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&b,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&b);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  pGVar4 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"b",&local_251);
  local_288[0] = 4;
  local_288[1] = 2;
  local_280 = (__buckets_ptr)local_288;
  local_278._0_8_ = (__buckets_ptr)0x2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&c + 7));
  __l_00._M_len = local_278._0_8_;
  __l_00._M_array = (iterator)local_280;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_278 + 8),__l_00,
             (allocator<unsigned_int> *)((long)&c + 7));
  pVVar5 = kratos::Generator::var
                     (pGVar4,&local_250,0x10,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_278 + 8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_278 + 8));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&c + 7));
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  pGVar4 = local_138;
  local_230 = pVVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"c",&local_2b9);
  local_2f0._M_nxt._0_4_ = 4;
  local_2f0._M_nxt._4_4_ = 2;
  local_2e8._M_nxt = &local_2f0;
  local_2e0 = (_Base_ptr)0x2;
  paVar1 = (allocator<unsigned_int> *)(gtest_msg.value.field_2._M_local_buf + 0xf);
  std::allocator<unsigned_int>::allocator(paVar1);
  __l._M_len = (size_type)local_2e0;
  __l._M_array = (iterator)local_2e8._M_nxt;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2d8,__l,paVar1);
  pVVar5 = kratos::Generator::var(pGVar4,&local_2b8,0x10,&local_2d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2d8);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)(gtest_msg.value.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  ppStack_318 = (pointer)0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  local_298 = pVVar5;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&stack0xfffffffffffffce8);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool
                    ((TrueWithString *)&stack0xfffffffffffffce8);
  if (bVar2) {
    local_330[0x17] = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      kratos::Var::assign((Var *)local_330,(Var *)local_178);
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_330);
    }
    if ((local_330[0x17] & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&stack0xfffffffffffffce8,
                 "Expected: a.assign(b) throws an exception of type StmtException.\n  Actual: it throws nothing."
                );
      goto LAB_0014c13a;
    }
  }
  else {
LAB_0014c13a:
    testing::Message::Message(local_370);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&gtest_msg_1.value.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x169,pcVar8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&gtest_msg_1.value.field_2 + 8),local_370);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&gtest_msg_1.value.field_2 + 8));
    testing::Message::~Message(local_370);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&stack0xfffffffffffffce8);
  gtest_msg_1.value._M_string_length = 0;
  gtest_msg_1.value.field_2._M_allocated_capacity = 0;
  _auStack_398 = (pointer)0x0;
  gtest_msg_1.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_1.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_398);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_398);
  if (bVar2) {
    local_399 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      pVVar5 = (Var *)(**(code **)(*(long *)local_178 + 0x48))(local_178,0);
      (*(local_230->super_IRNode)._vptr_IRNode[9])(local_230,0);
      kratos::Var::assign((Var *)&e_1,pVVar5);
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)&e_1);
    }
    if ((local_399 & 1) != 0) goto LAB_0014c581;
    std::__cxx11::string::operator=
              ((string *)auStack_398,
               "Expected: a[0].assign(b[0]) throws an exception of type StmtException.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_3e8);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_3f0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc",
             0x16a,pcVar8);
  testing::internal::AssertHelper::operator=(&local_3f0,local_3e8);
  testing::internal::AssertHelper::~AssertHelper(&local_3f0);
  testing::Message::~Message(local_3e8);
LAB_0014c581:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_398);
  gtest_msg_2.value._M_string_length = 0;
  gtest_msg_2.value.field_2._M_allocated_capacity = 0;
  ppStack_418 = (pointer)0x0;
  gtest_msg_2.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_2.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&ppStack_418);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&ppStack_418);
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      plVar9 = (long *)(**(code **)(*(long *)local_178 + 0x48))(local_178,0);
      pVVar5 = (Var *)(**(code **)(*plVar9 + 0x48))(plVar9,0);
      iVar3 = (*(local_230->super_IRNode)._vptr_IRNode[9])(local_230,0);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x48))
                ((long *)CONCAT44(extraout_var,iVar3),0);
      kratos::Var::assign((Var *)&e_2,pVVar5);
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)&e_2);
    }
  }
  else {
    testing::Message::Message(local_458);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&slice,
                   "Expected: a[0][0].assign(b[0][0]) doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ppStack_418
                  );
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x16b,pcVar8);
    testing::internal::AssertHelper::operator=(&local_460,local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    std::__cxx11::string::~string((string *)&slice);
    testing::Message::~Message(local_458);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&ppStack_418);
  pVVar5 = local_230;
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 1;
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_490,
             (int *)((long)&gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 4),(int *)&gtest_ar_2.message_);
  iVar3 = (*(pVVar5->super_IRNode)._vptr_IRNode[8])(pVVar5,local_490);
  local_488._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var_00,iVar3);
  pvVar6 = kratos::Var::size((Var *)local_488._M_pi);
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar6,1);
  local_4ac = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_4a8,"slice.size()[1]","2",pvVar7,&local_4ac);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar2) {
    testing::Message::Message(&local_4b8);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x16d,pcVar8);
    testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper(&local_4c0);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  gtest_msg_3.value._M_string_length = 0;
  gtest_msg_3.value.field_2._M_allocated_capacity = 0;
  local_4f8._16_8_ = (pointer)0x0;
  gtest_msg_3.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_3.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)(local_4f8 + 0x10));
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool
                    ((TrueWithString *)(local_4f8 + 0x10));
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    pVVar5 = local_230;
    if (bVar2) {
      local_508[1] = 1;
      local_508[0] = 0;
      std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
                (&local_500,local_508 + 1,local_508);
      iVar3 = (*(pVVar5->super_IRNode)._vptr_IRNode[8])(pVVar5,local_500);
      pVVar5 = local_298;
      e_3._4_4_ = 1;
      e_3._0_4_ = 0;
      std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
                (&local_510,(int *)((long)&e_3 + 4),(int *)&e_3);
      (*(pVVar5->super_IRNode)._vptr_IRNode[8])(pVVar5,local_510);
      kratos::Var::assign((Var *)local_4f8,(Var *)CONCAT44(extraout_var_01,iVar3));
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_4f8);
    }
  }
  else {
    testing::Message::Message(local_548);
    std::operator+(&local_570,
                   "Expected: (b[{1, 0}].assign(c[{1, 0}])) doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_4f8 + 0x10));
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_550,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x16e,pcVar8);
    testing::internal::AssertHelper::operator=(&local_550,local_548);
    testing::internal::AssertHelper::~AssertHelper(&local_550);
    std::__cxx11::string::~string((string *)&local_570);
    testing::Message::~Message(local_548);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)(local_4f8 + 0x10));
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(expr, md_array) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 16, {4, 2});
    a.set_is_packed(false);
    EXPECT_EQ(a.size()[0], 4);
    EXPECT_EQ(a.size()[1], 2);
    auto &b = mod.var("b", 16, {4, 2});
    auto &c = mod.var("c", 16, {4, 2});
    // mixture packed and unpacked
    EXPECT_THROW(a.assign(b), StmtException);
    EXPECT_THROW(a[0].assign(b[0]), StmtException);
    EXPECT_NO_THROW(a[0][0].assign(b[0][0]));
    auto &slice = b[{1, 0}];
    EXPECT_EQ(slice.size()[1], 2);
    EXPECT_NO_THROW((b[{1, 0}].assign(c[{1, 0}])));
}